

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O0

Sexp * Evaluate(Sexp *meaning,Sexp *act)

{
  bool bVar1;
  undefined1 local_60 [8];
  Trampoline local_58;
  undefined1 local_38 [8];
  Trampoline result;
  FrameProtector __frame_prot;
  Sexp *act_local;
  Sexp *meaning_local;
  
  FrameProtector::FrameProtector((FrameProtector *)&result.meaning,"Evaluate");
  Trampoline::Trampoline((Trampoline *)local_38,act,meaning);
  FrameProtector::ProtectValue((FrameProtector *)&result.meaning,(Sexp **)&result,"result.value");
  FrameProtector::ProtectValue
            ((FrameProtector *)&result.meaning,&result.field_1.value,"result.meaning");
  while( true ) {
    bVar1 = Trampoline::IsThunk((Trampoline *)local_38);
    if (!bVar1) {
      FrameProtector::~FrameProtector((FrameProtector *)&result.meaning);
      return (Sexp *)result._0_8_;
    }
    bVar1 = Sexp::IsActivation((Sexp *)result._0_8_);
    if (!bVar1) break;
    bVar1 = Sexp::IsMeaning(result.field_1.value);
    if (!bVar1) {
      __assert_fail("result.meaning->IsMeaning()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.cpp"
                    ,0x114,"Sexp *Evaluate(Sexp *, Sexp *)");
    }
    (**(code **)(((result.field_1.value)->field_1).activation)->parent)
              (local_60,((result.field_1.value)->field_1).activation,result._0_8_);
    result.kind = local_58.kind;
    result._4_4_ = local_58._4_4_;
    result.field_1 = local_58.field_1;
  }
  __assert_fail("result.activation->IsActivation()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/meaning.cpp"
                ,0x113,"Sexp *Evaluate(Sexp *, Sexp *)");
}

Assistant:

Sexp *Evaluate(Sexp *meaning, Sexp *act) {
  GC_HELPER_FRAME;

  Trampoline result(act, meaning);

  // important - the activation and value fields in Trampoline
  // have the same memory location, so only one GC_PROTECT
  // is required.
  GC_PROTECT(result.value);
  GC_PROTECT(result.meaning);

  while (result.IsThunk()) {
    assert(result.activation->IsActivation());
    assert(result.meaning->IsMeaning());
    result = result.meaning->meaning->Eval(result.activation);
  }

  return result.value;
}